

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O0

void duckdb::CheckDirectory(FileSystem *fs,string *file_path,CopyOverwriteMode overwrite_mode)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference pbVar5;
  undefined8 uVar6;
  char in_DL;
  string *in_RSI;
  long *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *__range2;
  value_type directory;
  idx_t dir_idx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  directory_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  file_list;
  string *in_stack_fffffffffffffe48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_fffffffffffffe50;
  allocator *paVar7;
  anon_class_32_4_2db6a624 *in_stack_fffffffffffffe58;
  long *plVar8;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe90;
  string local_160 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  IOException *in_stack_fffffffffffffec0;
  string local_138 [32];
  optional_ptr<duckdb::FileOpener,_true> local_118;
  reference local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_100;
  undefined1 *local_f8;
  undefined4 local_ec;
  long *local_e8;
  string *local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d8;
  undefined1 *local_d0;
  undefined1 local_c8 [32];
  string local_a8 [32];
  ulong local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80 [24];
  undefined1 local_68 [27];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [39];
  char local_11;
  string *local_10;
  long *local_8;
  
  if ((in_DL != '\x02') && (in_DL != '\x03')) {
    local_11 = in_DL;
    local_10 = in_RSI;
    local_8 = in_RDI;
    bVar2 = FileSystem::IsRemoteFile(in_stack_fffffffffffffe90);
    if ((bVar2) && (local_11 == '\x01')) {
      local_4d = 1;
      uVar6 = __cxa_allocate_exception(0x10);
      paVar7 = &local_39;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_38,"OVERWRITE is not supported for remote file systems",paVar7);
      NotImplementedException::NotImplementedException
                ((NotImplementedException *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_4d = 0;
      __cxa_throw(uVar6,&NotImplementedException::typeinfo,
                  NotImplementedException::~NotImplementedException);
    }
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            *)0x18668a6);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            *)0x18668b8);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe60,(value_type *)in_stack_fffffffffffffe58);
    for (local_88 = 0; uVar1 = local_88,
        sVar3 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(local_80), uVar1 < sVar3; local_88 = local_88 + 1) {
      pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
      ::std::__cxx11::string::string(local_a8,(string *)pvVar4);
      plVar8 = local_8;
      local_e8 = local_8;
      local_e0 = local_a8;
      local_d8 = local_80;
      local_d0 = local_68;
      ::std::function<void(std::__cxx11::string_const&,bool)>::
      function<duckdb::CheckDirectory(duckdb::FileSystem&,std::__cxx11::string_const&,duckdb::CopyOverwriteMode)::__0,void>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      (**(code **)(*plVar8 + 0x88))(plVar8,local_a8,local_c8,0);
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                   *)0x18669c1);
      ::std::__cxx11::string::~string(local_a8);
    }
    bVar2 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffffe60);
    if (bVar2) {
      local_ec = 1;
    }
    else {
      if (local_11 != '\x01') {
        uVar6 = __cxa_allocate_exception(0x10);
        paVar7 = (allocator *)&stack0xfffffffffffffec7;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_138,
                   "Directory \"%s\" is not empty! Enable OVERWRITE option to overwrite files",
                   paVar7);
        ::std::__cxx11::string::string(local_160,local_10);
        IOException::IOException<std::__cxx11::string>
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        __cxa_throw(uVar6,&IOException::typeinfo,IOException::~IOException);
      }
      local_f8 = local_68;
      local_100._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe48);
      local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffe48);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffe50,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffe48), bVar2) {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_100);
        plVar8 = local_8;
        local_110 = pbVar5;
        optional_ptr<duckdb::FileOpener,_true>::optional_ptr(&local_118,(FileOpener *)0x0);
        (**(code **)(*plVar8 + 0xa8))(plVar8,pbVar5,local_118.ptr);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_100);
      }
      local_ec = 0;
    }
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)0x1866c61);
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)0x1866c6e);
  }
  return;
}

Assistant:

void CheckDirectory(FileSystem &fs, const string &file_path, CopyOverwriteMode overwrite_mode) {
	if (overwrite_mode == CopyOverwriteMode::COPY_OVERWRITE_OR_IGNORE ||
	    overwrite_mode == CopyOverwriteMode::COPY_APPEND) {
		// with overwrite or ignore we fully ignore the presence of any files instead of erasing them
		return;
	}
	if (fs.IsRemoteFile(file_path) && overwrite_mode == CopyOverwriteMode::COPY_OVERWRITE) {
		// we can only remove files for local file systems currently
		// as remote file systems (e.g. S3) do not support RemoveFile
		throw NotImplementedException("OVERWRITE is not supported for remote file systems");
	}
	vector<string> file_list;
	vector<string> directory_list;
	directory_list.push_back(file_path);
	for (idx_t dir_idx = 0; dir_idx < directory_list.size(); dir_idx++) {
		auto directory = directory_list[dir_idx];
		fs.ListFiles(directory, [&](const string &path, bool is_directory) {
			auto full_path = fs.JoinPath(directory, path);
			if (is_directory) {
				directory_list.emplace_back(std::move(full_path));
			} else {
				file_list.emplace_back(std::move(full_path));
			}
		});
	}
	if (file_list.empty()) {
		return;
	}
	if (overwrite_mode == CopyOverwriteMode::COPY_OVERWRITE) {
		for (auto &file : file_list) {
			fs.RemoveFile(file);
		}
	} else {
		throw IOException("Directory \"%s\" is not empty! Enable OVERWRITE option to overwrite files", file_path);
	}
}